

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O3

IndexPair __thiscall
slang::IntervalMap<int,int,0u>::
modifyRoot<slang::IntervalMapDetails::BranchNode<int,12u,true>,slang::IntervalMapDetails::BranchNode<int,12u,false>,false>
          (IntervalMap<int,int,0u> *this,BranchNode<int,_12U,_true> *rootNode,uint32_t position,
          allocator_type *alloc)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  BranchNode<int,_12U,_false> *pBVar5;
  ulong *puVar6;
  long lVar7;
  uint uVar8;
  uint *puVar9;
  ulong uVar10;
  long lVar11;
  uint *puVar12;
  int iVar13;
  bool bVar14;
  uint32_t sizes [2];
  uint32_t local_58;
  uint local_54;
  ulong local_50 [2];
  IndexPair local_40;
  allocator_type *local_38;
  
  puVar12 = &local_58;
  puVar9 = &local_58;
  local_38 = alloc;
  local_40 = IntervalMapDetails::distribute(2,*(uint32_t *)(this + 0xc4),0x10,&local_58,position);
  iVar13 = 0;
  puVar6 = local_50 + 1;
  local_50[1] = 0;
  local_50[0] = 0;
  bVar4 = true;
  do {
    bVar14 = bVar4;
    pBVar5 = PoolAllocator<char,192ul,64ul>::
             emplace<slang::IntervalMapDetails::BranchNode<int,12u,false>>
                       ((PoolAllocator<char,192ul,64ul> *)local_38);
    uVar1 = *puVar12;
    if (uVar1 != 0) {
      lVar7 = 0;
      do {
        uVar8 = iVar13 + (int)lVar7;
        (pBVar5->
        super_NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<int>,_12U>
        ).first[lVar7].pip.value =
             (rootNode->
             super_NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<int>,_12U>
             ).first[uVar8].pip.value;
        (pBVar5->
        super_NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<int>,_12U>
        ).second[lVar7] =
             (rootNode->
             super_NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<int>,_12U>
             ).second[uVar8];
        lVar7 = lVar7 + 1;
      } while (uVar1 != (uint)lVar7);
    }
    iVar13 = iVar13 + uVar1;
    *puVar6 = (ulong)pBVar5 & 0xffffffffffffffc0 | (ulong)(uVar1 - 1);
    puVar6 = local_50;
    puVar12 = &local_54;
    bVar4 = false;
  } while (bVar14);
  lVar7 = 0;
  puVar6 = local_50 + 1;
  bVar4 = true;
  do {
    bVar14 = bVar4;
    uVar3 = *puVar6;
    uVar10 = uVar3 & 0xffffffffffffffc0;
    iVar13 = *(int *)(uVar10 + 100);
    if (1 < (ulong)*puVar9) {
      lVar11 = 0;
      do {
        iVar2 = *(int *)(uVar10 + 0x6c + lVar11 * 8);
        if (iVar13 <= iVar2) {
          iVar13 = iVar2;
        }
        lVar11 = lVar11 + 1;
      } while ((ulong)*puVar9 - 1 != lVar11);
    }
    *(ulong *)(this + lVar7 * 8 + 0x60) = CONCAT44(iVar13,*(undefined4 *)(uVar10 + 0x60));
    *(ulong *)(this + lVar7 * 8) = uVar3;
    lVar7 = 1;
    puVar9 = &local_54;
    puVar6 = local_50;
    bVar4 = false;
  } while (bVar14);
  *(undefined4 *)(this + 0xc4) = 2;
  *(int *)(this + 0xc0) = *(int *)(this + 0xc0) + 1;
  return local_40;
}

Assistant:

IntervalMapDetails::IndexPair IntervalMap<TKey, TValue, N>::modifyRoot(TRootNode& rootNode,
                                                                       uint32_t position,
                                                                       allocator_type& alloc) {
    using namespace IntervalMapDetails;

    // Split the root branch node into two new nodes.
    constexpr uint32_t NumNodes = 2;
    uint32_t sizes[NumNodes];
    IndexPair newOffset = distribute(NumNodes, rootSize, Leaf::Capacity, sizes, position);

    // Construct new nodes.
    uint32_t pos = 0;
    NodeRef nodes[NumNodes];
    for (uint32_t i = 0; i < NumNodes; i++) {
        auto newNode = alloc.template emplace<TNewNode>();
        uint32_t size = sizes[i];

        newNode->copy(rootNode, pos, 0, size);
        nodes[i] = NodeRef(newNode, size);
        pos += size;
    }

    if (SwitchToBranch) {
        // Destroy the old root leaf and switch it to a branch node.
        rootLeaf.~RootLeaf();
        new (&rootBranch) RootBranch();
    }

    for (uint32_t i = 0; i < NumNodes; i++) {
        rootBranch.keyAt(i) = nodes[i].template get<TNewNode>().getBounds(sizes[i]);
        rootBranch.childAt(i) = nodes[i];
    }

    rootSize = NumNodes;
    height++;
    return newOffset;
}